

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heter_queue_examples.cpp
# Opt level: O1

void density_tests::heterogeneous_queue_consume_operation_samples(void)

{
  ControlBlock *pCVar1;
  ulong uVar2;
  QueueControl *__tmp;
  runtime_type<> *prVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  ostream *poVar5;
  void *i_dest;
  int *piVar6;
  int *piVar7;
  long *plVar8;
  heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *phVar9;
  long lVar10;
  bool bVar11;
  consume_operation consume;
  heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> queue;
  consume_operation consume_5;
  heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> local_d0;
  const_iterator local_c0;
  consume_operation local_a0;
  const_iterator local_90;
  const_iterator local_70;
  const_iterator local_50;
  
  local_c0.m_control = (ControlBlock *)&DAT_0000ffef;
  local_c0.m_queue =
       (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
       &DAT_0000ffef;
  local_d0.m_head = (ControlBlock *)CONCAT44(local_d0.m_head._4_4_,0x2a);
  density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
  emplace<int,int>((heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>> *
                   )&local_c0,(int *)&local_d0);
  density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
  emplace<std::__cxx11::string,char_const(&)[13]>
            ((heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>> *)
             &local_c0,(char (*) [13])"Hello world!");
  local_d0.m_head = (ControlBlock *)0x4045000000000000;
  density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
  emplace<double,double>
            ((heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>> *)
             &local_c0,(double *)&local_d0);
  phVar9 = (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
           local_c0.m_control;
joined_r0x00a9fa4f:
  do {
    if (phVar9 == local_c0.m_queue) {
      phVar9 = (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
               0x0;
    }
    else {
      pCVar1 = phVar9->m_head;
      if (((ulong)pCVar1 & 3) != 0) {
        phVar9 = (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *
                 )((ulong)pCVar1 & 0xfffffffffffffff8);
        goto joined_r0x00a9fa4f;
      }
      phVar9->m_head = (ControlBlock *)((ulong)pCVar1 | 1);
    }
    local_d0.m_head = (ControlBlock *)&local_c0;
    local_d0.m_tail = (ControlBlock *)phVar9;
    if (phVar9 != (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                   *)0x0) {
      prVar3 = density::
               heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
               consume_operation::complete_type((consume_operation *)&local_d0);
      if (prVar3->m_feature_table ==
          (tuple_type *)
          density::detail::
          FeatureTable<std::tuple<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>,int>
          ::s_table) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Found an int: ",0xe);
        piVar6 = density::
                 heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
                 consume_operation::element<int>((consume_operation *)&local_d0);
        poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,*piVar6);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
LAB_00a9fb2c:
        std::ostream::put((char)poVar5);
        std::ostream::flush();
      }
      else {
        prVar3 = density::
                 heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
                 consume_operation::complete_type((consume_operation *)&local_d0);
        if (prVar3->m_feature_table ==
            (tuple_type *)
            density::detail::
            FeatureTable<std::tuple<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>,std::__cxx11::string>
            ::s_table) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"Found a string: ",0x10);
          pbVar4 = density::
                   heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
                   consume_operation::element<std::__cxx11::string>((consume_operation *)&local_d0);
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cout,(pbVar4->_M_dataplus)._M_p,
                              pbVar4->_M_string_length);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
          goto LAB_00a9fb2c;
        }
      }
      density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
      consume_operation::commit((consume_operation *)&local_d0);
    }
    if ((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
        local_d0.m_tail !=
        (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)0x0) {
      density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
      cancel_consume_impl((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                           *)local_d0.m_head,local_d0.m_tail);
    }
    bVar11 = phVar9 != (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                        *)0x0;
    phVar9 = (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
             local_c0.m_control;
  } while (bVar11);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::destroy
            ((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
             &local_c0);
  local_c0.m_control = (ControlBlock *)&DAT_0000ffef;
  local_c0.m_queue =
       (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
       &DAT_0000ffef;
  local_d0.m_head = (ControlBlock *)CONCAT44(local_d0.m_head._4_4_,0x2a);
  density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
  emplace<int,int>((heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>> *
                   )&local_c0,(int *)&local_d0);
  density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
  emplace<std::__cxx11::string,char_const(&)[13]>
            ((heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>> *)
             &local_c0,(char (*) [13])"Hello world!");
  local_d0.m_head = (ControlBlock *)0x4045000000000000;
  density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
  emplace<double,double>
            ((heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>> *)
             &local_c0,(double *)&local_d0);
  local_d0.m_tail = (ControlBlock *)0x0;
  bVar11 = density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
           ::consume_operation::start_consume_impl
                     ((consume_operation *)&local_d0,0,
                      (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                       *)&local_c0);
  if (bVar11) {
    do {
      prVar3 = density::
               heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
               consume_operation::complete_type((consume_operation *)&local_d0);
      if (prVar3->m_feature_table ==
          (tuple_type *)
          density::detail::
          FeatureTable<std::tuple<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>,int>
          ::s_table) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Found an int: ",0xe);
        piVar6 = density::
                 heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
                 consume_operation::element<int>((consume_operation *)&local_d0);
        poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,*piVar6);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
LAB_00a9fc9a:
        std::ostream::put((char)poVar5);
        std::ostream::flush();
      }
      else {
        prVar3 = density::
                 heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
                 consume_operation::complete_type((consume_operation *)&local_d0);
        if (prVar3->m_feature_table ==
            (tuple_type *)
            density::detail::
            FeatureTable<std::tuple<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>,std::__cxx11::string>
            ::s_table) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"Found a string: ",0x10);
          pbVar4 = density::
                   heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
                   consume_operation::element<std::__cxx11::string>((consume_operation *)&local_d0);
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cout,(pbVar4->_M_dataplus)._M_p,
                              pbVar4->_M_string_length);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
          goto LAB_00a9fc9a;
        }
      }
      density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
      consume_operation::commit((consume_operation *)&local_d0);
      bVar11 = density::
               heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
               consume_operation::start_consume_impl
                         ((consume_operation *)&local_d0,0,
                          (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                           *)&local_c0);
    } while (bVar11);
  }
  if (local_d0.m_tail != (ControlBlock *)0x0) {
    density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
    cancel_consume_impl((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                         *)local_d0.m_head,local_d0.m_tail);
  }
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::destroy
            ((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
             &local_c0);
  local_c0.m_control = (ControlBlock *)&DAT_0000ffef;
  local_c0.m_queue =
       (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
       &DAT_0000ffef;
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::destroy
            ((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
             &local_c0);
  local_c0.m_control = (ControlBlock *)&DAT_0000ffef;
  local_c0.m_queue =
       (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
       &DAT_0000ffef;
  local_d0.m_head = (ControlBlock *)CONCAT44(local_d0.m_head._4_4_,0x2a);
  density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
  emplace<int,int>((heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>> *
                   )&local_c0,(int *)&local_d0);
  local_d0.m_tail = local_c0.m_control;
  while ((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
         local_d0.m_tail != local_c0.m_queue) {
    pCVar1 = ((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
             local_d0.m_tail)->m_head;
    if (((ulong)pCVar1 & 3) == 0) {
      ((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
      local_d0.m_tail)->m_head = (ControlBlock *)((ulong)pCVar1 | 1);
      goto LAB_00a9fd52;
    }
    local_d0.m_tail = (ControlBlock *)((ulong)pCVar1 & 0xfffffffffffffff8);
  }
  local_d0.m_tail = (ControlBlock *)0x0;
LAB_00a9fd52:
  local_d0.m_head = (ControlBlock *)&local_c0;
  if ((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
      local_d0.m_tail ==
      (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)0x0) {
    __assert_fail("consume.empty() && !consume_1.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                  ,500,"void density_tests::heterogeneous_queue_consume_operation_samples()");
  }
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  consume_operation::commit((consume_operation *)&local_d0);
  if ((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
      local_d0.m_tail !=
      (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)0x0) {
    density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
    cancel_consume_impl((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                         *)local_d0.m_head,local_d0.m_tail);
  }
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::destroy
            ((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
             &local_c0);
  local_c0.m_control = (ControlBlock *)&DAT_0000ffef;
  local_c0.m_queue =
       (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
       &DAT_0000ffef;
  local_d0.m_head._0_4_ = 0x2a;
  density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
  emplace<int,int>((heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>> *
                   )&local_c0,(int *)&local_d0);
  local_d0.m_head = (ControlBlock *)CONCAT44(local_d0.m_head._4_4_,0x2b);
  density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
  emplace<int,int>((heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>> *
                   )&local_c0,(int *)&local_d0);
  local_d0.m_tail = local_c0.m_control;
  while ((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
         local_d0.m_tail != local_c0.m_queue) {
    pCVar1 = ((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
             local_d0.m_tail)->m_head;
    if (((ulong)pCVar1 & 3) == 0) {
      ((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
      local_d0.m_tail)->m_head = (ControlBlock *)((ulong)pCVar1 | 1);
      goto LAB_00a9fdf9;
    }
    local_d0.m_tail = (ControlBlock *)((ulong)pCVar1 & 0xfffffffffffffff8);
  }
  local_d0.m_tail = (ControlBlock *)0x0;
LAB_00a9fdf9:
  local_d0.m_head = (ControlBlock *)&local_c0;
  if ((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
      local_d0.m_tail ==
      (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)0x0) {
    __assert_fail("consume.empty() && !consume_1.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                  ,0x202,"void density_tests::heterogeneous_queue_consume_operation_samples()");
  }
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  consume_operation::commit((consume_operation *)&local_d0);
  if ((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
      local_d0.m_tail !=
      (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)0x0) {
    density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
    cancel_consume_impl((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                         *)local_d0.m_head,local_d0.m_tail);
  }
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::destroy
            ((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
             &local_c0);
  local_c0.m_control = (ControlBlock *)&DAT_0000ffef;
  local_c0.m_queue =
       (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
       &DAT_0000ffef;
  local_d0.m_head = (ControlBlock *)CONCAT44(local_d0.m_head._4_4_,0x2a);
  density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
  emplace<int,int>((heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>> *
                   )&local_c0,(int *)&local_d0);
  phVar9 = (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
           local_c0.m_control;
  while (phVar9 != local_c0.m_queue) {
    pCVar1 = phVar9->m_head;
    if (((ulong)pCVar1 & 3) == 0) {
      phVar9->m_head = (ControlBlock *)((ulong)pCVar1 | 1);
      goto LAB_00a9fe88;
    }
    phVar9 = (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
             ((ulong)pCVar1 & 0xfffffffffffffff8);
  }
  phVar9 = (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)0x0;
LAB_00a9fe88:
  if (phVar9 != (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
                0x0) {
    density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
    cancel_consume_impl((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                         *)&local_c0,(ControlBlock *)phVar9);
  }
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::destroy
            ((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
             &local_c0);
  local_c0.m_control = (ControlBlock *)&DAT_0000ffef;
  local_c0.m_queue =
       (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
       &DAT_0000ffef;
  local_d0.m_head._0_4_ = 0x2a;
  density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
  emplace<int,int>((heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>> *
                   )&local_c0,(int *)&local_d0);
  phVar9 = (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
           local_c0.m_control;
  while (phVar9 != local_c0.m_queue) {
    pCVar1 = phVar9->m_head;
    if (((ulong)pCVar1 & 3) == 0) {
      phVar9->m_head = (ControlBlock *)((ulong)pCVar1 | 1);
      goto LAB_00a9fef3;
    }
    phVar9 = (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
             ((ulong)pCVar1 & 0xfffffffffffffff8);
  }
  phVar9 = (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)0x0;
LAB_00a9fef3:
  if (phVar9 == (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
                0x0) {
    __assert_fail("!consume.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                  ,0x217,"void density_tests::heterogeneous_queue_consume_operation_samples()");
  }
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  cancel_consume_impl((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                       *)&local_c0,(ControlBlock *)phVar9);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::destroy
            ((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
             &local_c0);
  local_c0.m_control = (ControlBlock *)&DAT_0000ffef;
  local_c0.m_queue =
       (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
       &DAT_0000ffef;
  local_d0.m_head = (ControlBlock *)CONCAT44(local_d0.m_head._4_4_,0x2a);
  density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
  emplace<int,int>((heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>> *
                   )&local_c0,(int *)&local_d0);
  phVar9 = (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
           local_c0.m_control;
  while (phVar9 != local_c0.m_queue) {
    pCVar1 = phVar9->m_head;
    if (((ulong)pCVar1 & 3) == 0) {
      phVar9->m_head = (ControlBlock *)((ulong)pCVar1 | 1);
      goto LAB_00a9ff60;
    }
    phVar9 = (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
             ((ulong)pCVar1 & 0xfffffffffffffff8);
  }
  phVar9 = (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)0x0;
LAB_00a9ff60:
  if (phVar9 != (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
                0x0) {
    density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
    cancel_consume_impl((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                         *)&local_c0,(ControlBlock *)phVar9);
  }
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::destroy
            ((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
             &local_c0);
  local_c0.m_control = (ControlBlock *)&DAT_0000ffef;
  local_c0.m_queue =
       (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
       &DAT_0000ffef;
  local_d0.m_head = (ControlBlock *)CONCAT44(local_d0.m_head._4_4_,0x2a);
  density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
  emplace<int,int>((heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>> *
                   )&local_c0,(int *)&local_d0);
  phVar9 = (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
           local_c0.m_control;
  while (phVar9 != local_c0.m_queue) {
    pCVar1 = phVar9->m_head;
    if (((ulong)pCVar1 & 3) == 0) {
      phVar9->m_head = (ControlBlock *)((ulong)pCVar1 | 1);
      goto LAB_00a9ffcb;
    }
    phVar9 = (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
             ((ulong)pCVar1 & 0xfffffffffffffff8);
  }
  phVar9 = (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)0x0;
LAB_00a9ffcb:
  if (phVar9 == (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
                0x0) {
    __assert_fail("!consume.empty() && !!consume && consume.queue() == &queue",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                  ,0x22d,"void density_tests::heterogeneous_queue_consume_operation_samples()");
  }
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  cancel_consume_impl((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                       *)&local_c0,(ControlBlock *)phVar9);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::destroy
            ((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
             &local_c0);
  local_c0.m_control = (ControlBlock *)&DAT_0000ffef;
  local_c0.m_queue =
       (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
       &DAT_0000ffef;
  density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
  emplace<std::__cxx11::string,char_const(&)[4]>
            ((heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>> *)
             &local_c0,(char (*) [4])"abc");
  local_d0.m_tail = local_c0.m_control;
  while ((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
         local_d0.m_tail != local_c0.m_queue) {
    pCVar1 = ((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
             local_d0.m_tail)->m_head;
    if (((ulong)pCVar1 & 3) == 0) {
      ((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
      local_d0.m_tail)->m_head = (ControlBlock *)((ulong)pCVar1 | 1);
      goto LAB_00aa0037;
    }
    local_d0.m_tail = (ControlBlock *)((ulong)pCVar1 & 0xfffffffffffffff8);
  }
  local_d0.m_tail = (ControlBlock *)0x0;
LAB_00aa0037:
  local_d0.m_head = (ControlBlock *)&local_c0;
  prVar3 = density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
           ::consume_operation::complete_type((consume_operation *)&local_d0);
  i_dest = density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
           ::consume_operation::element_ptr((consume_operation *)&local_d0);
  density::runtime_type<>::destroy(prVar3,i_dest);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  consume_operation::commit_nodestroy((consume_operation *)&local_d0);
  if ((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
      local_d0.m_tail !=
      (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)0x0) {
    density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
    cancel_consume_impl((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                         *)local_d0.m_head,local_d0.m_tail);
  }
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::destroy
            ((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
             &local_c0);
  local_d0.m_head = (ControlBlock *)&DAT_0000ffef;
  local_d0.m_tail = (ControlBlock *)&DAT_0000ffef;
  local_c0.m_control = (ControlBlock *)CONCAT44(local_c0.m_control._4_4_,0x2a);
  density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
  emplace<int,int>((heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>> *
                   )&local_d0,(int *)&local_c0);
  local_a0.m_control = local_d0.m_head;
  while (local_a0.m_control != local_d0.m_tail) {
    uVar2 = (local_a0.m_control)->m_next;
    if ((uVar2 & 3) == 0) {
      (local_a0.m_control)->m_next = uVar2 | 1;
      goto LAB_00aa00dc;
    }
    local_a0.m_control = (ControlBlock *)(uVar2 & 0xfffffffffffffff8);
  }
  local_a0.m_control = (ControlBlock *)0x0;
LAB_00aa00dc:
  local_a0.m_queue = &local_d0;
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  consume_operation::cancel(&local_a0);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::cbegin
            (&local_50,&local_d0);
  local_c0.m_control = local_50.m_control;
  local_c0.m_queue = local_50.m_queue;
  if (local_50.m_control != (ControlBlock *)0x0) {
    lVar10 = 1;
    do {
      density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
      const_iterator::operator++(&local_c0);
      lVar10 = lVar10 + -1;
    } while (local_c0.m_control != (ControlBlock *)0x0);
    if (lVar10 == 0) {
      if (local_a0.m_control != (ControlBlock *)0x0) {
        density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
        cancel_consume_impl(local_a0.m_queue,local_a0.m_control);
      }
      density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
      destroy(&local_d0);
      local_d0.m_head = (ControlBlock *)&DAT_0000ffef;
      local_d0.m_tail = (ControlBlock *)&DAT_0000ffef;
      local_c0.m_control = (ControlBlock *)CONCAT44(local_c0.m_control._4_4_,0x2a);
      density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
      emplace<int,int>((heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>
                        *)&local_d0,(int *)&local_c0);
      local_a0.m_control = local_d0.m_head;
      while (local_a0.m_control != local_d0.m_tail) {
        uVar2 = (local_a0.m_control)->m_next;
        if ((uVar2 & 3) == 0) {
          (local_a0.m_control)->m_next = uVar2 | 1;
          goto LAB_00aa01b4;
        }
        local_a0.m_control = (ControlBlock *)(uVar2 & 0xfffffffffffffff8);
      }
      local_a0.m_control = (ControlBlock *)0x0;
LAB_00aa01b4:
      local_a0.m_queue = &local_d0;
      prVar3 = density::
               heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
               consume_operation::complete_type(&local_a0);
      if (prVar3->m_feature_table !=
          (tuple_type *)
          density::detail::
          FeatureTable<std::tuple<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>,int>
          ::s_table) {
        __assert_fail("consume.complete_type().is<int>()",
                      "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                      ,0x24e,"void density_tests::heterogeneous_queue_consume_operation_samples()");
      }
      prVar3 = density::
               heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
               consume_operation::complete_type(&local_a0);
      if (prVar3->m_feature_table !=
          (tuple_type *)
          density::detail::
          FeatureTable<std::tuple<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>,int>
          ::s_table) {
        __assert_fail("consume.complete_type() == runtime_type<>::make<int>()",
                      "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                      ,0x251,"void density_tests::heterogeneous_queue_consume_operation_samples()");
      }
      density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
      consume_operation::commit(&local_a0);
      density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
      cbegin(&local_70,&local_d0);
      local_c0.m_control = local_70.m_control;
      local_c0.m_queue = local_70.m_queue;
      if (local_70.m_control != (ControlBlock *)0x0) {
        do {
          density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
          ::const_iterator::operator++(&local_c0);
        } while (local_c0.m_control != (ControlBlock *)0x0);
        if (local_70.m_control != (ControlBlock *)0x0) {
          __assert_fail("std::distance(queue.cbegin(), queue.cend()) == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                        ,0x254,"void density_tests::heterogeneous_queue_consume_operation_samples()"
                       );
        }
      }
      if (local_a0.m_control != (ControlBlock *)0x0) {
        density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
        cancel_consume_impl(local_a0.m_queue,local_a0.m_control);
      }
      density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
      destroy(&local_d0);
      local_c0.m_control = (ControlBlock *)&DAT_0000ffef;
      local_c0.m_queue =
           (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
           &DAT_0000ffef;
      local_d0.m_head = (ControlBlock *)CONCAT44(local_d0.m_head._4_4_,0x2a);
      density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
      emplace<int,int>((heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>
                        *)&local_c0,(int *)&local_d0);
      local_d0.m_tail = local_c0.m_control;
      while ((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
             local_d0.m_tail != local_c0.m_queue) {
        pCVar1 = ((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                   *)local_d0.m_tail)->m_head;
        if (((ulong)pCVar1 & 3) == 0) {
          ((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
          local_d0.m_tail)->m_head = (ControlBlock *)((ulong)pCVar1 | 1);
          goto LAB_00aa02a5;
        }
        local_d0.m_tail = (ControlBlock *)((ulong)pCVar1 & 0xfffffffffffffff8);
      }
      local_d0.m_tail = (ControlBlock *)0x0;
LAB_00aa02a5:
      local_d0.m_head = (ControlBlock *)&local_c0;
      piVar6 = (int *)density::
                      heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                      ::consume_operation::element_ptr((consume_operation *)&local_d0);
      *piVar6 = *piVar6 + 1;
      piVar6 = density::
               heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
               consume_operation::element<int>((consume_operation *)&local_d0);
      if (*piVar6 != 0x2b) {
        __assert_fail("consume.element<int>() == 43",
                      "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                      ,0x25e,"void density_tests::heterogeneous_queue_consume_operation_samples()");
      }
      density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
      consume_operation::commit((consume_operation *)&local_d0);
      if ((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
          local_d0.m_tail !=
          (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)0x0) {
        density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
        cancel_consume_impl((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                             *)local_d0.m_head,local_d0.m_tail);
      }
      density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
      destroy((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
              &local_c0);
      local_d0.m_head = (ControlBlock *)&DAT_0000ffef;
      local_d0.m_tail = (ControlBlock *)&DAT_0000ffef;
      local_c0.m_control = (ControlBlock *)CONCAT44(local_c0.m_control._4_4_,0x2a);
      density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
      emplace<int,int>((heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>
                        *)&local_d0,(int *)&local_c0);
      local_a0.m_control = local_d0.m_head;
      while (local_a0.m_control != local_d0.m_tail) {
        uVar2 = (local_a0.m_control)->m_next;
        if ((uVar2 & 3) == 0) {
          (local_a0.m_control)->m_next = uVar2 | 1;
          goto LAB_00aa034c;
        }
        local_a0.m_control = (ControlBlock *)(uVar2 & 0xfffffffffffffff8);
      }
      local_a0.m_control = (ControlBlock *)0x0;
LAB_00aa034c:
      local_a0.m_queue = &local_d0;
      prVar3 = density::
               heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
               consume_operation::complete_type(&local_a0);
      if (prVar3->m_feature_table !=
          (tuple_type *)
          density::detail::
          FeatureTable<std::tuple<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>,int>
          ::s_table) {
        __assert_fail("consume_2.complete_type().is<int>()",
                      "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                      ,0x26d,"void density_tests::heterogeneous_queue_consume_operation_samples()");
      }
      prVar3 = density::
               heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
               consume_operation::complete_type(&local_a0);
      if (prVar3->m_feature_table !=
          (tuple_type *)
          density::detail::
          FeatureTable<std::tuple<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>,int>
          ::s_table) {
        __assert_fail("consume_2.complete_type() == runtime_type<>::make<int>()",
                      "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                      ,0x270,"void density_tests::heterogeneous_queue_consume_operation_samples()");
      }
      piVar6 = density::
               heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
               consume_operation::element<int>(&local_a0);
      if (*piVar6 != 0x2a) {
        __assert_fail("consume_2.element<int>() == 42",
                      "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                      ,0x271,"void density_tests::heterogeneous_queue_consume_operation_samples()");
      }
      density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
      consume_operation::commit(&local_a0);
      density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
      cbegin(&local_90,&local_d0);
      local_c0.m_control = local_90.m_control;
      local_c0.m_queue = local_90.m_queue;
      if (local_90.m_control != (ControlBlock *)0x0) {
        do {
          density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
          ::const_iterator::operator++(&local_c0);
        } while (local_c0.m_control != (ControlBlock *)0x0);
        if (local_90.m_control != (ControlBlock *)0x0) {
          __assert_fail("std::distance(queue.cbegin(), queue.cend()) == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                        ,0x274,"void density_tests::heterogeneous_queue_consume_operation_samples()"
                       );
        }
      }
      if (local_a0.m_control != (ControlBlock *)0x0) {
        density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
        cancel_consume_impl(local_a0.m_queue,local_a0.m_control);
      }
      density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
      destroy(&local_d0);
      local_c0.m_control = (ControlBlock *)&DAT_0000ffef;
      local_c0.m_queue =
           (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
           &DAT_0000ffef;
      local_d0.m_head = (ControlBlock *)CONCAT44(local_d0.m_head._4_4_,0x2a);
      density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
      emplace<int,int>((heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>
                        *)&local_c0,(int *)&local_d0);
      local_d0.m_tail = local_c0.m_control;
      while ((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
             local_d0.m_tail != local_c0.m_queue) {
        pCVar1 = ((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                   *)local_d0.m_tail)->m_head;
        if (((ulong)pCVar1 & 3) == 0) {
          ((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
          local_d0.m_tail)->m_head = (ControlBlock *)((ulong)pCVar1 | 1);
          goto LAB_00aa0450;
        }
        local_d0.m_tail = (ControlBlock *)((ulong)pCVar1 & 0xfffffffffffffff8);
      }
      local_d0.m_tail = (ControlBlock *)0x0;
LAB_00aa0450:
      local_d0.m_head = (ControlBlock *)&local_c0;
      piVar6 = (int *)density::
                      heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                      ::consume_operation::unaligned_element_ptr((consume_operation *)&local_d0);
      piVar7 = (int *)density::
                      heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                      ::consume_operation::element_ptr((consume_operation *)&local_d0);
      if (piVar6 != piVar7) {
        __assert_fail("unaligned_ptr == consume.element_ptr()",
                      "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                      ,0x286,"void density_tests::heterogeneous_queue_consume_operation_samples()");
      }
      if (((ulong)piVar6 & 3) != 0) {
        __assert_fail("address_is_aligned(element_ptr, alignof(int))",
                      "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                      ,0x289,"void density_tests::heterogeneous_queue_consume_operation_samples()");
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"An int: ",8);
      plVar8 = (long *)std::ostream::operator<<((ostream *)&std::cout,*piVar6);
      std::ios::widen((char)*(undefined8 *)(*plVar8 + -0x18) + (char)plVar8);
      std::ostream::put((char)plVar8);
      std::ostream::flush();
      density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
      consume_operation::commit((consume_operation *)&local_d0);
      if ((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
          local_d0.m_tail !=
          (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)0x0) {
        density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
        cancel_consume_impl((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                             *)local_d0.m_head,local_d0.m_tail);
      }
      density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
      destroy((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
              &local_c0);
      local_c0.m_control = (ControlBlock *)&DAT_0000ffef;
      local_c0.m_queue =
           (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
           &DAT_0000ffef;
      local_d0.m_head = (ControlBlock *)CONCAT44(local_d0.m_head._4_4_,0x2a);
      density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
      emplace<int,int>((heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>
                        *)&local_c0,(int *)&local_d0);
      local_d0.m_tail = local_c0.m_control;
      do {
        if ((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
            local_d0.m_tail == local_c0.m_queue) {
          local_d0.m_tail = (ControlBlock *)0x0;
LAB_00aa0550:
          local_d0.m_head = (ControlBlock *)&local_c0;
          prVar3 = density::
                   heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                   ::consume_operation::complete_type((consume_operation *)&local_d0);
          if (prVar3->m_feature_table ==
              (tuple_type *)
              density::detail::
              FeatureTable<std::tuple<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>,int>
              ::s_table) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"An int: ",8);
            piVar6 = density::
                     heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                     ::consume_operation::element<int>((consume_operation *)&local_d0);
            plVar8 = (long *)std::ostream::operator<<((ostream *)&std::cout,*piVar6);
            std::ios::widen((char)*(undefined8 *)(*plVar8 + -0x18) + (char)plVar8);
            std::ostream::put((char)plVar8);
            std::ostream::flush();
            density::
            heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
            consume_operation::commit((consume_operation *)&local_d0);
            if ((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
                local_d0.m_tail !=
                (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
                0x0) {
              density::
              heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
              cancel_consume_impl((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                                   *)local_d0.m_head,local_d0.m_tail);
            }
            density::
            heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
            destroy((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                     *)&local_c0);
            return;
          }
          __assert_fail("consume.complete_type().is<int>()",
                        "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                        ,0x294,"void density_tests::heterogeneous_queue_consume_operation_samples()"
                       );
        }
        pCVar1 = ((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                   *)local_d0.m_tail)->m_head;
        if (((ulong)pCVar1 & 3) == 0) {
          ((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
          local_d0.m_tail)->m_head = (ControlBlock *)((ulong)pCVar1 | 1);
          goto LAB_00aa0550;
        }
        local_d0.m_tail = (ControlBlock *)((ulong)pCVar1 & 0xfffffffffffffff8);
      } while( true );
    }
  }
  __assert_fail("std::distance(queue.cbegin(), queue.cend()) == 1",
                "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                ,0x245,"void density_tests::heterogeneous_queue_consume_operation_samples()");
}

Assistant:

void heterogeneous_queue_consume_operation_samples()
    {
        using namespace density;
        {

            //! [heter_queue consume_operation consume_1 example 1]
            heter_queue<> queue;
            queue.push(42);
            queue.emplace<std::string>("Hello world!");
            queue.push(42.);

            while (auto consume = queue.try_start_consume())
            {
                if (consume.complete_type().is<int>())
                    std::cout << "Found an int: " << consume.element<int>() << std::endl;
                else if (consume.complete_type().is<std::string>())
                    std::cout << "Found a string: " << consume.element<std::string>() << std::endl;
                consume.commit();
            }
            //! [heter_queue consume_operation consume_1 example 1]
        }
        {
            //! [heter_queue consume_operation consume_1 example 2]
            heter_queue<> queue;
            queue.push(42);
            queue.emplace<std::string>("Hello world!");
            queue.push(42.);

            heter_queue<>::consume_operation consume;
            while (queue.try_start_consume(consume))
            {
                if (consume.complete_type().is<int>())
                    std::cout << "Found an int: " << consume.element<int>() << std::endl;
                else if (consume.complete_type().is<std::string>())
                    std::cout << "Found a string: " << consume.element<std::string>() << std::endl;
                consume.commit();
            }
            //! [heter_queue consume_operation consume_1 example 2]
        }

        {
            heter_queue<> queue;
            //! [heter_queue consume_operation default_construct example 1]
            heter_queue<>::consume_operation consume;
            assert(consume.empty());
            //! [heter_queue consume_operation default_construct example 1]
        }

        //! [heter_queue consume_operation copy_construct example 1]
        static_assert(!std::is_copy_constructible<heter_queue<>::consume_operation>::value, "");
        //! [heter_queue consume_operation copy_construct example 1]

        //! [heter_queue consume_operation copy_assign example 1]
        static_assert(!std::is_copy_assignable<heter_queue<>::consume_operation>::value, "");
        //! [heter_queue consume_operation copy_assign example 1]

        {
            //! [heter_queue consume_operation move_construct example 1]
            heter_queue<> queue;

            queue.push(42);
            auto consume = queue.try_start_consume();

            auto consume_1 = std::move(consume);
            assert(consume.empty() && !consume_1.empty());
            consume_1.commit();
            //! [heter_queue consume_operation move_construct example 1]
        }
        {
            //! [heter_queue consume_operation move_assign example 1]
            heter_queue<> queue;

            queue.push(42);
            queue.push(43);
            auto consume = queue.try_start_consume();

            heter_queue<>::consume_operation consume_1;
            consume_1 = std::move(consume);
            assert(consume.empty() && !consume_1.empty());
            consume_1.commit();
            //! [heter_queue consume_operation move_assign example 1]
        }
        {
            //! [heter_queue consume_operation destroy example 1]
            heter_queue<> queue;
            queue.push(42);

            // this consumed is started and destroyed before being committed, so it has no observable effects
            queue.try_start_consume();
            //! [heter_queue consume_operation destroy example 1]
        }
        {
            //! [heter_queue consume_operation empty example 1]
            heter_queue<> queue;
            queue.push(42);

            heter_queue<>::consume_operation consume;
            assert(consume.empty());
            consume = queue.try_start_consume();
            assert(!consume.empty());
            //! [heter_queue consume_operation empty example 1]
        }
        {
            //! [heter_queue consume_operation operator_bool example 1]
            heter_queue<> queue;
            queue.push(42);

            heter_queue<>::consume_operation consume;
            assert(consume.empty() == !consume);
            consume = queue.try_start_consume();
            assert(consume.empty() == !consume);
            //! [heter_queue consume_operation operator_bool example 1]
        }
        {
            //! [heter_queue consume_operation queue example 1]
            heter_queue<> queue;
            queue.push(42);

            heter_queue<>::consume_operation consume;
            assert(consume.empty() && !consume && consume.queue() == nullptr);
            consume = queue.try_start_consume();
            assert(!consume.empty() && !!consume && consume.queue() == &queue);
            //! [heter_queue consume_operation queue example 1]
        }
        {
            //! [heter_queue consume_operation commit_nodestroy example 1]
            heter_queue<> queue;
            queue.emplace<std::string>("abc");

            heter_queue<>::consume_operation consume = queue.try_start_consume();
            consume.complete_type().destroy(consume.element_ptr());

            // the string has already been destroyed. Calling commit would trigger an undefined behavior
            consume.commit_nodestroy();
            //! [heter_queue consume_operation commit_nodestroy example 1]
        }
        {
            //! [heter_queue consume_operation cancel example 1]
            heter_queue<> queue;
            queue.push(42);

            heter_queue<>::consume_operation consume = queue.try_start_consume();
            consume.cancel();

            // there is still a 42 in the queue
            assert(std::distance(queue.cbegin(), queue.cend()) == 1);
            //! [heter_queue consume_operation cancel example 1]
        }
        {
            //! [heter_queue consume_operation complete_type example 1]
            heter_queue<> queue;
            queue.push(42);

            heter_queue<>::consume_operation consume = queue.try_start_consume();
            assert(consume.complete_type().is<int>());
            assert(
              consume.complete_type() ==
              runtime_type<>::make<int>()); // same to the previous assert
            consume.commit();

            assert(std::distance(queue.cbegin(), queue.cend()) == 0);
            //! [heter_queue consume_operation complete_type example 1]
        }
        {
            //! [heter_queue consume_operation element_ptr example 1]
            heter_queue<> queue;
            queue.push(42);

            heter_queue<>::consume_operation consume = queue.try_start_consume();
            ++*static_cast<int *>(consume.element_ptr());
            assert(consume.element<int>() == 43);
            consume.commit();
            //! [heter_queue consume_operation element_ptr example 1]
        }
        {
            //! [heter_queue consume_operation swap example 1]
            heter_queue<> queue;
            queue.push(42);

            heter_queue<>::consume_operation consume_1 = queue.try_start_consume();
            heter_queue<>::consume_operation consume_2;
            {
                using namespace std;
                swap(consume_1, consume_2);
            }
            assert(consume_2.complete_type().is<int>());
            assert(
              consume_2.complete_type() ==
              runtime_type<>::make<int>()); // same to the previous assert
            assert(consume_2.element<int>() == 42);
            consume_2.commit();

            assert(std::distance(queue.cbegin(), queue.cend()) == 0);
            //! [heter_queue consume_operation swap example 1]
        }
        {
            //! [heter_queue consume_operation unaligned_element_ptr example 1]
            heter_queue<> queue;
            queue.push(42);

            heter_queue<>::consume_operation consume = queue.try_start_consume();
            bool const   is_overaligned              = alignof(int) > heter_queue<>::min_alignment;
            void * const unaligned_ptr               = consume.unaligned_element_ptr();
            int *        element_ptr;
            if (is_overaligned)
            {
                element_ptr = static_cast<int *>(address_upper_align(unaligned_ptr, alignof(int)));
            }
            else
            {
                assert(unaligned_ptr == consume.element_ptr());
                element_ptr = static_cast<int *>(unaligned_ptr);
            }
            assert(address_is_aligned(element_ptr, alignof(int)));
            std::cout << "An int: " << *element_ptr << std::endl;
            consume.commit();
            //! [heter_queue consume_operation unaligned_element_ptr example 1]
        }
        {
            //! [heter_queue consume_operation element example 1]
            heter_queue<> queue;
            queue.push(42);

            heter_queue<>::consume_operation consume = queue.try_start_consume();
            assert(consume.complete_type().is<int>());
            std::cout << "An int: " << consume.element<int>() << std::endl;
            /* std::cout << "An float: " << consume.element<float>() << std::endl; this would
        trigger an undefined behavior, because the element is not a float */
            consume.commit();
            //! [heter_queue consume_operation element example 1]
        }
    }